

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::ReadSmd(SMDImporter *this,string *pFile,IOSystem *pIOHandler)

{
  uint uVar1;
  IOStream *__p;
  pointer pIVar2;
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  string local_48;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_28;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  SMDImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"rb",&local_49);
  __p = IOSystem::Open(pIOHandler,pFile,&local_48);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_28,__p);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_28)
  ;
  if (pIVar2 == (pointer)0x0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a0,"Failed to open SMD/VTA file ",pFile);
    std::operator+(&local_80,&local_a0,".");
    DeadlyImportError::DeadlyImportError(this_00,&local_80);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_28);
  uVar1 = (*pIVar2->_vptr_IOStream[6])();
  this->iFileSize = uVar1;
  std::vector<char,_std::allocator<char>_>::resize(&this->mBuffer,(ulong)(this->iFileSize + 1));
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_28)
  ;
  BaseImporter::TextFileToBuffer(pIVar2,&this->mBuffer,FORBID_EMPTY);
  this->iSmallestFrame = 0x7fffffff;
  this->bHasUVs = true;
  this->iLineNumber = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->aszTextures,10);
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::reserve
            (&this->asTriangles,1000);
  std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::reserve(&this->asBones,0x14);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->aszTextures);
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::clear(&this->asTriangles);
  std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::clear(&this->asBones);
  ParseFile(this);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

void SMDImporter::ReadSmd(const std::string &pFile, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

    // Check whether we can read from the file
    if (file.get() == nullptr) {
        throw DeadlyImportError("Failed to open SMD/VTA file " + pFile + ".");
    }

    iFileSize = (unsigned int)file->FileSize();

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer.resize(iFileSize + 1);
    TextFileToBuffer(file.get(), mBuffer);

    iSmallestFrame = INT_MAX;
    bHasUVs = true;
    iLineNumber = 1;

    // Reserve enough space for ... hm ... 10 textures
    aszTextures.reserve(10);

    // Reserve enough space for ... hm ... 1000 triangles
    asTriangles.reserve(1000);

    // Reserve enough space for ... hm ... 20 bones
    asBones.reserve(20);

    aszTextures.clear();
    asTriangles.clear();
    asBones.clear();

    // parse the file ...
    ParseFile();
}